

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVarLengthArray<void_*,_32LL>::QVarLengthArray
          (QVarLengthArray<void_*,_32LL> *this,QVarLengthArray<void_*,_32LL> *other)

{
  (this->super_QVLABase<void_*>).super_QVLABaseBase.a = 0x20;
  (this->super_QVLABase<void_*>).super_QVLABaseBase.s = 0;
  (this->super_QVLABase<void_*>).super_QVLABaseBase.ptr = &this->super_QVLAStorage<8UL,_8UL,_32LL>;
  QVLABase<void_*>::append_impl
            (&this->super_QVLABase<void_*>,0x20,&this->super_QVLAStorage<8UL,_8UL,_32LL>,
             (void **)(other->super_QVLABase<void_*>).super_QVLABaseBase.ptr,
             (other->super_QVLABase<void_*>).super_QVLABaseBase.s);
  return;
}

Assistant:

QVarLengthArray(const QVarLengthArray &other)
        : QVarLengthArray{}
    {
        append(other.constData(), other.size());
    }